

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

CPT * __thiscall despot::HierarchyCPT::CreateNoisyVariant(HierarchyCPT *this,double noise)

{
  NamedVar *child;
  pointer ppTVar1;
  HierarchyCPT *this_00;
  TabularCPT *pTVar2;
  int i;
  ulong uVar3;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_30;
  
  this_00 = (HierarchyCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_30,
             &(this->super_CPT).super_Function.parents_);
  HierarchyCPT(this_00,child,
               (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_30);
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&local_30);
  uVar3 = 0;
  while( true ) {
    ppTVar1 = (this->cpts_).
              super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->cpts_).
                      super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar3)
    break;
    pTVar2 = (TabularCPT *)
             (**(code **)((long)(ppTVar1[uVar3]->super_CPT).super_Function._vptr_Function + 0x88))
                       (noise);
    (this_00->cpts_).super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar3] = pTVar2;
    uVar3 = uVar3 + 1;
  }
  return &this_00->super_CPT;
}

Assistant:

CPT* HierarchyCPT::CreateNoisyVariant(double noise) const {
	HierarchyCPT* hcpt = new HierarchyCPT(child_, parents_);
	for (int i = 0; i < cpts_.size(); i++)
		hcpt->cpts_[i] = static_cast<TabularCPT*>(cpts_[i]->CreateNoisyVariant(
			noise));
	return hcpt;
}